

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

int duckdb_lz4::LZ4_compress_fast
              (char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int iVar1;
  LZ4_stream_t *ctxPtr;
  LZ4_stream_t ctx;
  int result;
  int in_stack_ffffffffffffbffc;
  int in_stack_ffffffffffffc000;
  int in_stack_ffffffffffffc004;
  char *in_stack_ffffffffffffc008;
  char *in_stack_ffffffffffffc010;
  void *in_stack_ffffffffffffc018;
  
  iVar1 = LZ4_compress_fast_extState
                    (in_stack_ffffffffffffc018,in_stack_ffffffffffffc010,in_stack_ffffffffffffc008,
                     in_stack_ffffffffffffc004,in_stack_ffffffffffffc000,in_stack_ffffffffffffbffc);
  return iVar1;
}

Assistant:

int LZ4_compress_fast(const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    int result;
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctxPtr = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctxPtr == NULL) return 0;
#else
    LZ4_stream_t ctx;
    LZ4_stream_t* const ctxPtr = &ctx;
#endif
    result = LZ4_compress_fast_extState(ctxPtr, source, dest, inputSize, maxOutputSize, acceleration);

#if (LZ4_HEAPMODE)
    FREEMEM(ctxPtr);
#endif
    return result;
}